

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O0

void absl::lts_20240722::base_internal::LowLevelAlloc::Free(void *v)

{
  char *absl_raw_log_internal_basename;
  undefined1 local_b0 [8];
  ArenaLock section;
  Arena *arena;
  AllocList *f;
  void *v_local;
  
  if (v != (void *)0x0) {
    section.arena_ = *(Arena **)((long)v + -0x10);
    anon_unknown_0::ArenaLock::ArenaLock((ArenaLock *)local_b0,section.arena_);
    AddToFreelist(v,section.arena_);
    if ((section.arena_)->allocation_count < 1) {
      absl::lts_20240722::raw_log_internal::RawLog
                (kFatal,"low_level_alloc.cc",0x203,"Check %s failed: %s",
                 "arena->allocation_count > 0","nothing in arena to free","low_level_alloc.cc");
      __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/base/internal/low_level_alloc.cc"
                    ,0x203,"static void absl::base_internal::LowLevelAlloc::Free(void *)");
    }
    (section.arena_)->allocation_count = (section.arena_)->allocation_count + -1;
    anon_unknown_0::ArenaLock::Leave((ArenaLock *)local_b0);
    anon_unknown_0::ArenaLock::~ArenaLock((ArenaLock *)local_b0);
  }
  return;
}

Assistant:

void LowLevelAlloc::Free(void *v) {
  if (v != nullptr) {
    AllocList *f = reinterpret_cast<AllocList *>(reinterpret_cast<char *>(v) -
                                                 sizeof(f->header));
    LowLevelAlloc::Arena *arena = f->header.arena;
    ArenaLock section(arena);
    AddToFreelist(v, arena);
    ABSL_RAW_CHECK(arena->allocation_count > 0, "nothing in arena to free");
    arena->allocation_count--;
    section.Leave();
  }
}